

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  float *pfVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint _w;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  void *pvVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  void *pvVar32;
  ulong uVar33;
  ulong uVar34;
  float *pfVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  ulong local_138;
  allocator_type local_111;
  ulong local_110;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar18 = bottom_blob->w;
  iVar20 = bottom_blob->h;
  uVar17 = bottom_blob->c;
  uVar36 = (ulong)uVar17;
  sVar6 = bottom_blob->elemsize;
  if (this->global_pooling != 0) {
    Mat::create(top_blob,uVar17,sVar6,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar19 = iVar20 * iVar18;
    if (this->pooling_type == 0) {
      if ((int)uVar17 < 1) {
        return 0;
      }
      pvVar10 = bottom_blob->data;
      lVar12 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar32 = top_blob->data;
      uVar24 = 0;
      pvVar28 = pvVar10;
      do {
        fVar39 = *(float *)((long)pvVar10 + lVar12 * uVar24);
        if (0 < (int)uVar19) {
          uVar27 = 0;
          do {
            fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
            if (fVar39 <= fVar1) {
              fVar39 = fVar1;
            }
            uVar27 = uVar27 + 1;
          } while (uVar19 != uVar27);
        }
        *(float *)((long)pvVar32 + uVar24 * 4) = fVar39;
        uVar24 = uVar24 + 1;
        pvVar28 = (void *)((long)pvVar28 + lVar12);
      } while (uVar24 != uVar36);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar17 < 1) {
        return 0;
      }
      pvVar10 = bottom_blob->data;
      sVar6 = bottom_blob->cstep;
      pvVar32 = top_blob->data;
      sVar7 = bottom_blob->elemsize;
      uVar24 = 0;
      do {
        fVar39 = 0.0;
        if (0 < (int)uVar19) {
          uVar27 = 0;
          do {
            fVar39 = fVar39 + *(float *)((long)pvVar10 + uVar27 * 4);
            uVar27 = uVar27 + 1;
          } while (uVar19 != uVar27);
        }
        *(float *)((long)pvVar32 + uVar24 * 4) = fVar39 * (1.0 / (float)(int)uVar19);
        uVar24 = uVar24 + 1;
        pvVar10 = (void *)((long)pvVar10 + sVar6 * sVar7);
      } while (uVar24 != uVar36);
    }
    return 0;
  }
  bottom_blob_bordered.data = bottom_blob->data;
  piVar8 = bottom_blob->refcount;
  bottom_blob_bordered.refcount._0_4_ = SUB84(piVar8,0);
  bottom_blob_bordered.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
  bottom_blob_bordered.elemsize._0_4_ = (undefined4)sVar6;
  bottom_blob_bordered.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
  bottom_blob_bordered.elempack = bottom_blob->elempack;
  bottom_blob_bordered.allocator = bottom_blob->allocator;
  bottom_blob_bordered.dims = bottom_blob->dims;
  bottom_blob_bordered.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  if (this->pooling_type == 0) {
    fVar39 = -3.4028235e+38;
  }
  else {
    fVar39 = 0.0;
  }
  bottom_blob_bordered.h = iVar20;
  bottom_blob_bordered.c = uVar17;
  bottom_blob_bordered.w = iVar18;
  switch(this->pad_mode) {
  case 0:
    iVar11 = this->pad_left;
    local_110 = CONCAT44(local_110._4_4_,iVar11);
    iVar26 = ((iVar18 + iVar11 + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar14 = ((iVar20 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
    iVar15 = this->stride_w - iVar26;
    if (iVar26 == 0) {
      iVar15 = 0;
    }
    iVar26 = this->stride_h - iVar14;
    if (iVar14 == 0) {
      iVar26 = 0;
    }
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)opt;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)opt->workspace_allocator;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)opt->workspace_allocator;
    copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom + iVar26,
                     iVar11,this->pad_right + iVar15,0,fVar39,(Option *)&_space_ofs);
    bVar38 = (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0;
    if (bottom_blob_bordered.data != (void *)0x0 && bVar38) {
      iVar18 = bottom_blob_bordered.w;
      iVar20 = bottom_blob_bordered.h;
    }
    iVar11 = -100;
    if (bottom_blob_bordered.data == (void *)0x0 || !bVar38) goto LAB_00142f02;
    break;
  case 1:
    iVar26 = 0;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)opt;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)opt->workspace_allocator;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)opt->workspace_allocator;
    copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom,this->pad_left
                     ,this->pad_right,0,fVar39,(Option *)&_space_ofs);
    bVar38 = (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0;
    if (bottom_blob_bordered.data != (void *)0x0 && bVar38) {
      iVar18 = bottom_blob_bordered.w;
      iVar20 = bottom_blob_bordered.h;
    }
    iVar11 = -100;
    iVar15 = 0;
    if (bottom_blob_bordered.data == (void *)0x0 || !bVar38) goto LAB_00142f02;
    break;
  case 2:
    iVar15 = ~((iVar18 + -1) % this->stride_w) + this->kernel_w;
    iVar26 = ~((iVar20 + -1) % this->stride_h) + this->kernel_h;
    if ((iVar15 < 1) && (iVar26 < 1)) {
LAB_001426ca:
      bVar38 = true;
      iVar18 = bottom_blob_bordered.w;
      iVar20 = bottom_blob_bordered.h;
    }
    else {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(bottom_blob,&bottom_blob_bordered,iVar26 / 2,iVar26 - iVar26 / 2,iVar15 / 2,
                       iVar15 - iVar15 / 2,0,fVar39,(Option *)&_space_ofs);
      if (bottom_blob_bordered.data == (void *)0x0) {
        bVar38 = false;
      }
      else {
        if ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0) goto LAB_001426ca;
        bVar38 = false;
      }
    }
    goto joined_r0x001428c4;
  case 3:
    iVar26 = ~((iVar18 + -1) % this->stride_w) + this->kernel_w;
    iVar15 = ~((iVar20 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar26) || (0 < iVar15)) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(bottom_blob,&bottom_blob_bordered,iVar15 - iVar15 / 2,iVar15 / 2,
                       iVar26 - iVar26 / 2,iVar26 / 2,0,fVar39,(Option *)&_space_ofs);
      if ((bottom_blob_bordered.data == (void *)0x0) ||
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) {
        bVar38 = false;
        goto joined_r0x001428c4;
      }
    }
    bVar38 = true;
    iVar18 = bottom_blob_bordered.w;
    iVar20 = bottom_blob_bordered.h;
joined_r0x001428c4:
    iVar15 = 0;
    iVar26 = 0;
    iVar11 = -100;
    if (!bVar38) goto LAB_00142f02;
    break;
  default:
    iVar26 = 0;
    iVar15 = 0;
  }
  iVar14 = (iVar18 - this->kernel_w) / this->stride_w;
  uVar24 = (long)(iVar20 - this->kernel_h) / (long)this->stride_h;
  local_110 = uVar24 & 0xffffffff;
  _w = iVar14 + 1;
  uVar19 = (int)uVar24 + 1;
  uVar24 = (ulong)uVar19;
  Mat::create(top_blob,_w,uVar19,uVar17,sVar6,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar27 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar27,&local_111);
    if (0 < this->kernel_h) {
      iVar20 = this->kernel_w;
      iVar11 = 0;
      iVar16 = 0;
      iVar21 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar12 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar21 + lVar12] = iVar16 + (int)lVar12;
            lVar12 = lVar12 + 1;
            iVar23 = (int)lVar12;
          } while (iVar23 < this->kernel_w);
          iVar21 = iVar21 + iVar23;
          iVar16 = iVar16 + iVar23;
        }
        iVar16 = iVar16 + (iVar18 - iVar20);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->kernel_h);
    }
    iVar18 = (int)uVar27;
    if (this->pooling_type == 0) {
      if (0 < (int)uVar17) {
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        pvVar10 = top_blob->data;
        local_138 = 0;
        do {
          if (-1 < (int)local_110) {
            pvVar32 = (void *)(sVar6 * sVar7 * local_138 + (long)pvVar10);
            iVar20 = this->stride_h;
            iVar15 = this->stride_w;
            uVar24 = 0;
            do {
              if (-1 < iVar14) {
                lVar12 = (long)(iVar20 * bottom_blob_bordered.w * (int)uVar24) *
                         CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                  (undefined4)bottom_blob_bordered.elemsize) +
                         bottom_blob_bordered.cstep *
                         CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                  (undefined4)bottom_blob_bordered.elemsize) * local_138;
                uVar33 = 0;
                do {
                  lVar25 = uVar33 * (long)iVar15;
                  fVar39 = *(float *)((long)bottom_blob_bordered.data + lVar25 * 4 + lVar12);
                  if (0 < iVar18) {
                    uVar34 = 0;
                    do {
                      fVar1 = *(float *)((long)bottom_blob_bordered.data +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar34] * 4 +
                                        lVar25 * 4 + lVar12);
                      if (fVar39 <= fVar1) {
                        fVar39 = fVar1;
                      }
                      uVar34 = uVar34 + 1;
                    } while ((uVar27 & 0xffffffff) != uVar34);
                  }
                  *(float *)((long)pvVar32 + uVar33 * 4) = fVar39;
                  uVar33 = uVar33 + 1;
                } while (uVar33 != _w);
              }
              pvVar32 = (void *)((long)pvVar32 + (long)(int)_w * 4);
              uVar24 = uVar24 + 1;
            } while (uVar24 != (int)local_110 + 1);
          }
          local_138 = local_138 + 1;
        } while (local_138 != uVar36);
      }
    }
    else if ((this->pooling_type == 1) && (0 < (int)uVar17)) {
      pfVar9 = (float *)top_blob->data;
      iVar20 = this->pad_top;
      iVar11 = this->kernel_h;
      lVar12 = top_blob->cstep * top_blob->elemsize;
      iVar16 = this->kernel_w;
      iVar21 = this->pad_bottom;
      pfVar30 = (float *)((long)(top_blob->w * (int)local_110) * top_blob->elemsize + (long)pfVar9);
      iVar23 = this->pad_left;
      iVar2 = this->pad_right;
      uVar33 = (ulong)_w;
      pfVar29 = pfVar9 + iVar14;
      iVar3 = this->avgpool_count_include_pad;
      local_138 = 0;
      pfVar31 = pfVar9;
      pfVar35 = pfVar9;
      do {
        if (-1 < (int)local_110) {
          pfVar13 = (float *)(lVar12 * local_138 + (long)pfVar9);
          iVar4 = this->stride_h;
          iVar5 = this->stride_w;
          uVar34 = 0;
          do {
            if (-1 < iVar14) {
              uVar22 = 0;
              do {
                if (iVar18 < 1) {
                  fVar39 = 0.0;
                }
                else {
                  fVar39 = 0.0;
                  uVar37 = 0;
                  do {
                    fVar39 = fVar39 + *(float *)((long)bottom_blob_bordered.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar37] * 4 +
                                                uVar22 * (long)iVar5 * 4 +
                                                (long)(iVar4 * bottom_blob_bordered.w * (int)uVar34)
                                                * CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                                           (undefined4)bottom_blob_bordered.elemsize
                                                          ) +
                                                bottom_blob_bordered.cstep *
                                                CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                                         (undefined4)bottom_blob_bordered.elemsize)
                                                * local_138);
                    uVar37 = uVar37 + 1;
                  } while ((uVar27 & 0xffffffff) != uVar37);
                }
                pfVar13[uVar22] = fVar39 * (1.0 / (float)iVar18);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar33);
            }
            pfVar13 = pfVar13 + (int)_w;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar24);
        }
        if (iVar3 == 0) {
          if ((iVar20 != 0) && (-1 < iVar14)) {
            uVar34 = 0;
            do {
              pfVar35[uVar34] = pfVar35[uVar34] * (float)iVar11 * (1.0 / (float)(iVar11 - iVar20));
              uVar34 = uVar34 + 1;
            } while (uVar33 != uVar34);
          }
          if ((iVar21 != -iVar26) && (-1 < iVar14)) {
            uVar34 = 0;
            do {
              pfVar30[uVar34] =
                   pfVar30[uVar34] * (float)iVar11 * (1.0 / (float)(iVar11 - (iVar26 + iVar21)));
              uVar34 = uVar34 + 1;
            } while (uVar33 != uVar34);
          }
          pfVar13 = pfVar31;
          uVar34 = uVar24;
          if (iVar23 != 0 && -1 < (int)local_110) {
            do {
              *pfVar13 = *pfVar13 * (float)iVar16 * (1.0 / (float)(iVar16 - iVar23));
              uVar17 = (int)uVar34 - 1;
              pfVar13 = pfVar13 + (long)iVar14 + 1;
              uVar34 = (ulong)uVar17;
            } while (uVar17 != 0);
          }
          pfVar13 = pfVar29;
          uVar34 = uVar24;
          if (iVar2 != -iVar15 && -1 < (int)local_110) {
            do {
              *pfVar13 = *pfVar13 * (float)iVar16 * (1.0 / (float)(iVar16 - (iVar2 + iVar15)));
              uVar17 = (int)uVar34 - 1;
              pfVar13 = pfVar13 + (long)iVar14 + 1;
              uVar34 = (ulong)uVar17;
            } while (uVar17 != 0);
          }
        }
        local_138 = local_138 + 1;
        pfVar35 = (float *)((long)pfVar35 + lVar12);
        pfVar30 = (float *)((long)pfVar30 + lVar12);
        pfVar31 = (float *)((long)pfVar31 + lVar12);
        pfVar29 = (float *)((long)pfVar29 + lVar12);
      } while (local_138 != uVar36);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar11 = 0;
  }
LAB_00142f02:
  piVar8 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_bordered.allocator + 0x18))();
      }
    }
  }
  return iVar11;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            if (avgpool_count_include_pad == 0)
            {
                // fix pad
                if (pad_top != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_top);

                    outptr = top_blob.channel(q).row(0);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_bottom + htailpad != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                    outptr = top_blob.channel(q).row(outh - 1);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_left != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_left);

                    outptr = top_blob.channel(q);
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
                if (pad_right + wtailpad != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                    outptr = top_blob.channel(q);
                    outptr += outw - 1;
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}